

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceArrayIntersectorKMB<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  size_t sVar1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar2;
  float fVar3;
  float fVar4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  bool bVar7;
  undefined4 uVar8;
  ulong uVar9;
  long lVar10;
  NodeRef *pNVar11;
  int iVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  uint uVar16;
  size_t sVar17;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar21;
  undefined1 auVar22 [64];
  vfloat_impl<4> __tmp;
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  float fVar29;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  undefined1 in_ZMM2 [64];
  vint4 ai_2;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 ai_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_3;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi_1;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi_3;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 ai;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi_2;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  vint<4> octant;
  Precalculations pre;
  undefined1 local_1788 [16];
  vbool<4> valid_leaf;
  undefined1 local_1768 [16];
  RayQueryContext *local_1750;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  float local_16e8;
  float fStack_16e4;
  float fStack_16e0;
  float fStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar20 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar26 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar20);
    iVar12 = vmovmskps_avx(auVar26);
    uVar13 = CONCAT44((int)((ulong)This >> 0x20),iVar12);
    if (iVar12 != 0) {
      auVar31 = *(undefined1 (*) [16])(ray + 0x40);
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar51 = vandps_avx(auVar31,auVar23);
      auVar35._8_4_ = 0x219392ef;
      auVar35._0_8_ = 0x219392ef219392ef;
      auVar35._12_4_ = 0x219392ef;
      auVar51 = vcmpps_avx(auVar51,auVar35,1);
      auVar25 = vblendvps_avx(auVar31,auVar35,auVar51);
      auVar51 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar23);
      auVar51 = vcmpps_avx(auVar51,auVar35,1);
      auVar32 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar35,auVar51);
      auVar51 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar23);
      auVar51 = vcmpps_avx(auVar51,auVar35,1);
      auVar51 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar35,auVar51);
      auVar23 = vrcpps_avx(auVar25);
      local_1738 = auVar23._0_4_;
      auVar30._0_4_ = auVar25._0_4_ * local_1738;
      fStack_1734 = auVar23._4_4_;
      auVar30._4_4_ = auVar25._4_4_ * fStack_1734;
      fStack_1730 = auVar23._8_4_;
      auVar30._8_4_ = auVar25._8_4_ * fStack_1730;
      fStack_172c = auVar23._12_4_;
      auVar30._12_4_ = auVar25._12_4_ * fStack_172c;
      auVar48._8_4_ = 0x3f800000;
      auVar48._0_8_ = &DAT_3f8000003f800000;
      auVar48._12_4_ = 0x3f800000;
      auVar23 = vsubps_avx(auVar48,auVar30);
      auVar25 = vrcpps_avx(auVar32);
      local_1748 = auVar25._0_4_;
      auVar36._0_4_ = auVar32._0_4_ * local_1748;
      fStack_1744 = auVar25._4_4_;
      auVar36._4_4_ = auVar32._4_4_ * fStack_1744;
      fStack_1740 = auVar25._8_4_;
      auVar36._8_4_ = auVar32._8_4_ * fStack_1740;
      fStack_173c = auVar25._12_4_;
      auVar36._12_4_ = auVar32._12_4_ * fStack_173c;
      auVar32 = vsubps_avx(auVar48,auVar36);
      auVar25 = vrcpps_avx(auVar51);
      fVar3 = auVar25._0_4_;
      auVar45._0_4_ = auVar51._0_4_ * fVar3;
      fVar4 = auVar25._4_4_;
      auVar45._4_4_ = auVar51._4_4_ * fVar4;
      fVar24 = auVar25._8_4_;
      auVar45._8_4_ = auVar51._8_4_ * fVar24;
      fVar27 = auVar25._12_4_;
      auVar45._12_4_ = auVar51._12_4_ * fVar27;
      auVar25 = vsubps_avx(auVar48,auVar45);
      auVar30 = ZEXT816(0);
      auVar31 = vcmpps_avx(auVar31,auVar30,1);
      auVar51._8_4_ = 1;
      auVar51._0_8_ = 0x100000001;
      auVar51._12_4_ = 1;
      auVar31 = vandps_avx(auVar51,auVar31);
      auVar51 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar30,1);
      auVar52._8_4_ = 2;
      auVar52._0_8_ = 0x200000002;
      auVar52._12_4_ = 2;
      auVar51 = vandps_avx(auVar51,auVar52);
      auVar53 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar51 = vorps_avx(auVar51,auVar31);
      auVar31 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar30,1);
      auVar49._8_4_ = 4;
      auVar49._0_8_ = 0x400000004;
      auVar49._12_4_ = 4;
      auVar31 = vandps_avx(auVar49,auVar31);
      auVar54 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar55 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      auVar20 = vpor_avx(auVar26 ^ auVar20,auVar31);
      local_1768 = vpor_avx(auVar51,auVar20);
      do {
        lVar10 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
          }
        }
        uVar8 = *(undefined4 *)(local_1768 + lVar10 * 4);
        auVar20._4_4_ = uVar8;
        auVar20._0_4_ = uVar8;
        auVar20._8_4_ = uVar8;
        auVar20._12_4_ = uVar8;
        auVar20 = vpcmpeqd_avx(auVar20,local_1768);
        uVar8 = vmovmskps_avx(auVar20);
        uVar13 = uVar13 & ~CONCAT44((int)((ulong)lVar10 >> 0x20),uVar8);
      } while (uVar13 != 0);
      auVar20 = vpcmpeqd_avx(local_1768,local_1768);
      auVar31 = vpcmpeqd_avx(auVar20,(undefined1  [16])valid_i->field_0);
      local_1738 = local_1738 + auVar23._0_4_ * local_1738;
      fStack_1734 = fStack_1734 + auVar23._4_4_ * fStack_1734;
      fStack_1730 = fStack_1730 + auVar23._8_4_ * fStack_1730;
      fStack_172c = fStack_172c + auVar23._12_4_ * fStack_172c;
      local_1748 = local_1748 + local_1748 * auVar32._0_4_;
      fStack_1744 = fStack_1744 + fStack_1744 * auVar32._4_4_;
      fStack_1740 = fStack_1740 + fStack_1740 * auVar32._8_4_;
      fStack_173c = fStack_173c + fStack_173c * auVar32._12_4_;
      local_16e8 = auVar25._0_4_ * fVar3 + fVar3;
      fStack_16e4 = auVar25._4_4_ * fVar4 + fVar4;
      fStack_16e0 = auVar25._8_4_ * fVar24 + fVar24;
      fStack_16dc = auVar25._12_4_ * fVar27 + fVar27;
      auVar20 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT416(0) << 0x20);
      auVar26 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT416(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_16f8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar20,auVar31);
      auVar25._8_4_ = 0xff800000;
      auVar25._0_8_ = 0xff800000ff800000;
      auVar25._12_4_ = 0xff800000;
      local_1788 = vblendvps_avx(auVar25,auVar26,auVar31);
      pNVar11 = stack_node + 2;
      paVar18 = &stack_near[2].field_0;
      local_1768 = vorps_avx(auVar31,local_1768);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      stack_near[1].field_0 = local_16f8;
      local_1750 = context;
      do {
        paVar18 = paVar18 + -1;
        sVar17 = pNVar11[-1].ptr;
        pNVar11 = pNVar11 + -1;
        bVar7 = true;
        if (sVar17 != 0xfffffffffffffff8) {
          auVar22 = ZEXT1664((undefined1  [16])*paVar18);
          auVar20 = vcmpps_avx((undefined1  [16])*paVar18,local_1788,1);
          if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar20[0xf] < '\0') {
            do {
              auVar20 = auVar22._0_16_;
              uVar16 = (uint)sVar17;
              local_1708 = auVar53._0_16_;
              local_1718 = auVar54._0_16_;
              local_1728 = auVar55._0_16_;
              if ((sVar17 & 8) != 0) {
                if (sVar17 == 0xfffffffffffffff8) goto LAB_00336583;
                valid_leaf.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vcmpps_avx(local_1788,auVar20,6)
                ;
                if (((((undefined1  [16])valid_leaf.field_0 >> 0x1f & (undefined1  [16])0x1) !=
                      (undefined1  [16])0x0 ||
                     ((undefined1  [16])valid_leaf.field_0 >> 0x3f & (undefined1  [16])0x1) !=
                     (undefined1  [16])0x0) ||
                    ((undefined1  [16])valid_leaf.field_0 >> 0x5f & (undefined1  [16])0x1) !=
                    (undefined1  [16])0x0) || valid_leaf.field_0._15_1_ < '\0') {
                  lVar10 = (ulong)(uVar16 & 0xf) - 8;
                  if (lVar10 != 0) {
                    prim = (Primitive_conflict4 *)(sVar17 & 0xfffffffffffffff0);
                    do {
                      InstanceArrayIntersectorKMB<4>::intersect
                                (&valid_leaf,&pre,ray,local_1750,prim);
                      prim = prim + 1;
                      lVar10 = lVar10 + -1;
                    } while (lVar10 != 0);
                  }
                  local_1788 = vblendvps_avx(local_1788,*(undefined1 (*) [16])(ray + 0x80),
                                             (undefined1  [16])valid_leaf.field_0);
                  auVar53 = ZEXT1664(local_1708);
                  auVar54 = ZEXT1664(local_1718);
                  auVar55 = ZEXT1664(local_1728);
                }
                break;
              }
              uVar9 = sVar17 & 0xfffffffffffffff0;
              uVar15 = 0;
              auVar22 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              uVar13 = 0;
              sVar17 = 8;
              do {
                sVar1 = *(size_t *)(uVar9 + uVar13 * 8);
                if (sVar1 != 8) {
                  fVar3 = *(float *)(uVar9 + 0x80 + uVar13 * 4);
                  fVar4 = *(float *)(uVar9 + 0x20 + uVar13 * 4);
                  auVar26 = *(undefined1 (*) [16])(ray + 0x70);
                  fVar24 = auVar26._0_4_;
                  fVar27 = auVar26._4_4_;
                  fVar28 = auVar26._8_4_;
                  fVar29 = auVar26._12_4_;
                  auVar31._0_4_ = fVar24 * fVar3 + fVar4;
                  auVar31._4_4_ = fVar27 * fVar3 + fVar4;
                  auVar31._8_4_ = fVar28 * fVar3 + fVar4;
                  auVar31._12_4_ = fVar29 * fVar3 + fVar4;
                  fVar3 = *(float *)(uVar9 + 0xa0 + uVar13 * 4);
                  fVar4 = *(float *)(uVar9 + 0x40 + uVar13 * 4);
                  auVar32._0_4_ = fVar24 * fVar3 + fVar4;
                  auVar32._4_4_ = fVar27 * fVar3 + fVar4;
                  auVar32._8_4_ = fVar28 * fVar3 + fVar4;
                  auVar32._12_4_ = fVar29 * fVar3 + fVar4;
                  fVar3 = *(float *)(uVar9 + 0xc0 + uVar13 * 4);
                  fVar4 = *(float *)(uVar9 + 0x60 + uVar13 * 4);
                  auVar37._0_4_ = fVar24 * fVar3 + fVar4;
                  auVar37._4_4_ = fVar27 * fVar3 + fVar4;
                  auVar37._8_4_ = fVar28 * fVar3 + fVar4;
                  auVar37._12_4_ = fVar29 * fVar3 + fVar4;
                  fVar3 = *(float *)(uVar9 + 0x90 + uVar13 * 4);
                  fVar4 = *(float *)(uVar9 + 0x30 + uVar13 * 4);
                  auVar40._0_4_ = fVar24 * fVar3 + fVar4;
                  auVar40._4_4_ = fVar27 * fVar3 + fVar4;
                  auVar40._8_4_ = fVar28 * fVar3 + fVar4;
                  auVar40._12_4_ = fVar29 * fVar3 + fVar4;
                  fVar3 = *(float *)(uVar9 + 0xb0 + uVar13 * 4);
                  fVar4 = *(float *)(uVar9 + 0x50 + uVar13 * 4);
                  auVar43._0_4_ = fVar4 + fVar24 * fVar3;
                  auVar43._4_4_ = fVar4 + fVar27 * fVar3;
                  auVar43._8_4_ = fVar4 + fVar28 * fVar3;
                  auVar43._12_4_ = fVar4 + fVar29 * fVar3;
                  fVar3 = *(float *)(uVar9 + 0xd0 + uVar13 * 4);
                  fVar4 = *(float *)(uVar9 + 0x70 + uVar13 * 4);
                  auVar46._0_4_ = fVar3 * fVar24 + fVar4;
                  auVar46._4_4_ = fVar3 * fVar27 + fVar4;
                  auVar46._8_4_ = fVar3 * fVar28 + fVar4;
                  auVar46._12_4_ = fVar3 * fVar29 + fVar4;
                  auVar31 = vsubps_avx(auVar31,local_1708);
                  auVar50._0_4_ = local_1738 * auVar31._0_4_;
                  auVar50._4_4_ = fStack_1734 * auVar31._4_4_;
                  auVar50._8_4_ = fStack_1730 * auVar31._8_4_;
                  auVar50._12_4_ = fStack_172c * auVar31._12_4_;
                  auVar31 = vsubps_avx(auVar32,local_1718);
                  auVar33._0_4_ = local_1748 * auVar31._0_4_;
                  auVar33._4_4_ = fStack_1744 * auVar31._4_4_;
                  auVar33._8_4_ = fStack_1740 * auVar31._8_4_;
                  auVar33._12_4_ = fStack_173c * auVar31._12_4_;
                  auVar31 = vsubps_avx(auVar37,local_1728);
                  auVar38._0_4_ = local_16e8 * auVar31._0_4_;
                  auVar38._4_4_ = fStack_16e4 * auVar31._4_4_;
                  auVar38._8_4_ = fStack_16e0 * auVar31._8_4_;
                  auVar38._12_4_ = fStack_16dc * auVar31._12_4_;
                  auVar31 = vsubps_avx(auVar40,local_1708);
                  auVar41._0_4_ = local_1738 * auVar31._0_4_;
                  auVar41._4_4_ = fStack_1734 * auVar31._4_4_;
                  auVar41._8_4_ = fStack_1730 * auVar31._8_4_;
                  auVar41._12_4_ = fStack_172c * auVar31._12_4_;
                  auVar31 = vsubps_avx(auVar43,local_1718);
                  auVar44._0_4_ = local_1748 * auVar31._0_4_;
                  auVar44._4_4_ = fStack_1744 * auVar31._4_4_;
                  auVar44._8_4_ = fStack_1740 * auVar31._8_4_;
                  auVar44._12_4_ = fStack_173c * auVar31._12_4_;
                  auVar31 = vsubps_avx(auVar46,local_1728);
                  auVar47._0_4_ = local_16e8 * auVar31._0_4_;
                  auVar47._4_4_ = fStack_16e4 * auVar31._4_4_;
                  auVar47._8_4_ = fStack_16e0 * auVar31._8_4_;
                  auVar47._12_4_ = fStack_16dc * auVar31._12_4_;
                  auVar31 = vpminsd_avx(auVar50,auVar41);
                  auVar51 = vpminsd_avx(auVar33,auVar44);
                  auVar31 = vpmaxsd_avx(auVar31,auVar51);
                  auVar51 = vpminsd_avx(auVar38,auVar47);
                  auVar31 = vpmaxsd_avx(auVar31,auVar51);
                  auVar51 = vpmaxsd_avx(auVar50,auVar41);
                  auVar25 = vpmaxsd_avx(auVar33,auVar44);
                  auVar25 = vpminsd_avx(auVar51,auVar25);
                  auVar51 = vpmaxsd_avx(auVar38,auVar47);
                  auVar51 = vpminsd_avx(auVar51,local_1788);
                  auVar25 = vpminsd_avx(auVar25,auVar51);
                  auVar51 = vpmaxsd_avx(auVar31,(undefined1  [16])local_16f8);
                  if ((uVar16 & 7) == 6) {
                    auVar51 = vcmpps_avx(auVar51,auVar25,2);
                    uVar8 = *(undefined4 *)(uVar9 + 0xe0 + uVar13 * 4);
                    auVar39._4_4_ = uVar8;
                    auVar39._0_4_ = uVar8;
                    auVar39._8_4_ = uVar8;
                    auVar39._12_4_ = uVar8;
                    auVar25 = vcmpps_avx(auVar39,auVar26,2);
                    uVar8 = *(undefined4 *)(uVar9 + 0xf0 + uVar13 * 4);
                    auVar42._4_4_ = uVar8;
                    auVar42._0_4_ = uVar8;
                    auVar42._8_4_ = uVar8;
                    auVar42._12_4_ = uVar8;
                    auVar26 = vcmpps_avx(auVar26,auVar42,1);
                    auVar26 = vandps_avx(auVar25,auVar26);
                    auVar26 = vandps_avx(auVar26,auVar51);
                  }
                  else {
                    auVar26 = vcmpps_avx(auVar51,auVar25,2);
                  }
                  auVar51 = vcmpps_avx(local_1788,auVar20,6);
                  auVar26 = vandps_avx(auVar26,auVar51);
                  auVar26 = vpslld_avx(auVar26,0x1f);
                  if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar26[0xf] < '\0') {
                    auVar34._8_4_ = 0x7f800000;
                    auVar34._0_8_ = 0x7f8000007f800000;
                    auVar34._12_4_ = 0x7f800000;
                    aVar2 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                            vblendvps_avx(auVar34,auVar31,auVar26);
                    aVar21 = auVar22._0_16_;
                    auVar26 = vcmpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar21,1);
                    sVar14 = sVar1;
                    aVar5 = aVar21;
                    aVar6 = aVar2;
                    if (((((auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                          (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         -1 < auVar26[0xf]) ||
                       (bVar19 = sVar17 != 8, sVar14 = sVar17, sVar17 = sVar1, aVar5 = aVar2,
                       aVar6 = aVar21, bVar19)) {
                      uVar15 = uVar15 + 1;
                      pNVar11->ptr = sVar14;
                      pNVar11 = pNVar11 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18->v = aVar6;
                      paVar18 = paVar18 + 1;
                      auVar22 = ZEXT1664((undefined1  [16])aVar5);
                    }
                    else {
                      auVar22 = ZEXT1664((undefined1  [16])aVar2);
                    }
                  }
                }
              } while ((sVar1 != 8) && (bVar19 = uVar13 < 3, uVar13 = uVar13 + 1, bVar19));
              if (1 < uVar15 && sVar17 != 8) {
                aVar2 = paVar18[-2];
                auVar20 = vcmpps_avx((undefined1  [16])aVar2,(undefined1  [16])paVar18[-1],1);
                if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar20[0xf] < '\0') {
                  paVar18[-2] = paVar18[-1];
                  paVar18[-1] = aVar2;
                  auVar20 = vpermilps_avx(*(undefined1 (*) [16])(pNVar11 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar11 + -2) = auVar20;
                }
                if (uVar15 != 2) {
                  aVar2 = paVar18[-3];
                  auVar20 = vcmpps_avx((undefined1  [16])aVar2,(undefined1  [16])paVar18[-1],1);
                  if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar20[0xf] < '\0') {
                    paVar18[-3] = paVar18[-1];
                    paVar18[-1] = aVar2;
                    sVar1 = pNVar11[-3].ptr;
                    pNVar11[-3].ptr = pNVar11[-1].ptr;
                    pNVar11[-1].ptr = sVar1;
                  }
                  aVar2 = paVar18[-3];
                  auVar20 = vcmpps_avx((undefined1  [16])aVar2,(undefined1  [16])paVar18[-2],1);
                  if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar20[0xf] < '\0') {
                    paVar18[-3] = paVar18[-2];
                    paVar18[-2] = aVar2;
                    auVar20 = vpermilps_avx(*(undefined1 (*) [16])(pNVar11 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar11 + -3) = auVar20;
                  }
                }
              }
            } while (sVar17 != 8);
          }
          bVar7 = false;
        }
LAB_00336583:
      } while (!bVar7);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }